

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O3

RepRef __thiscall
absl::cord_internal::anon_unknown_16::CordRepAnalyzer::CountLinearReps
          (CordRepAnalyzer *this,RepRef rep,MemoryUsage *memory_usage)

{
  size_t *psVar1;
  long *plVar2;
  byte bVar3;
  CordzStatistics *pCVar4;
  size_t sVar5;
  sbyte sVar6;
  long lVar7;
  size_t sVar8;
  int iVar9;
  CordRep *pCVar10;
  long lVar11;
  uint uVar12;
  sbyte sVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar19;
  undefined1 auVar18 [16];
  RepRef RVar20;
  
  sVar8 = rep.refcount;
  pCVar10 = rep.rep;
  if (pCVar10 == (CordRep *)0x0) {
    pCVar10 = (CordRep *)0x0;
  }
  else {
    while( true ) {
      bVar3 = pCVar10->tag;
      uVar19 = (undefined4)(sVar8 >> 0x20);
      if (bVar3 != 1) break;
      pCVar4 = this->statistics_;
      psVar1 = &pCVar4->node_count;
      *psVar1 = *psVar1 + 1;
      psVar1 = &(pCVar4->node_counts).substring;
      *psVar1 = *psVar1 + 1;
      memory_usage->total = memory_usage->total + 0x20;
      auVar18._8_4_ = uVar19;
      auVar18._0_8_ = sVar8;
      auVar18._12_4_ = 0x45300000;
      memory_usage->fair_share =
           32.0 / ((auVar18._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0)) +
           memory_usage->fair_share;
      pCVar10 = *(CordRep **)&pCVar10[1].refcount;
      if (pCVar10 == (CordRep *)0x0) goto LAB_00138cb4;
      sVar8 = sVar8 * (long)((pCVar10->refcount).count_.super___atomic_base<int>._M_i >> 1);
    }
    if (bVar3 == 0) {
      __assert_fail("false && \"rep == nullptr || rep->tag != CordRepKind::UNUSED_0\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                    ,0x87,
                    "auto absl::cord_internal::(anonymous namespace)::CordRepAnalyzer::RepRef::tag()::(anonymous class)::operator()() const"
                   );
    }
    if (bVar3 < 6) {
      if (bVar3 != 5) goto LAB_00138cb8;
      pCVar4 = this->statistics_;
      psVar1 = &pCVar4->node_count;
      *psVar1 = *psVar1 + 1;
      psVar1 = &(pCVar4->node_counts).external;
      *psVar1 = *psVar1 + 1;
      lVar7 = pCVar10->length + 0x28;
    }
    else {
      if (0xf8 < bVar3) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
      }
      iVar9 = -0xb8000;
      if (bVar3 < 0xbb) {
        iVar9 = -0xe80;
      }
      sVar13 = 0xc;
      if (bVar3 < 0xbb) {
        sVar13 = 6;
      }
      iVar14 = -0x10;
      if (0x42 < bVar3) {
        iVar14 = iVar9;
      }
      sVar6 = 3;
      if (0x42 < bVar3) {
        sVar6 = sVar13;
      }
      uVar12 = ((uint)bVar3 << sVar6) + iVar14;
      lVar7 = (long)(int)uVar12;
      pCVar4 = this->statistics_;
      sVar5 = (pCVar4->node_counts).flat;
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      auVar17._12_4_ = 0xffffffff;
      pCVar4->node_count = pCVar4->node_count + 1;
      (pCVar4->node_counts).flat = sVar5 - auVar17._8_8_;
      lVar11 = 0x28;
      if ((((uVar12 < 0x41) || (lVar11 = 0x30, uVar12 < 0x81)) || (lVar11 = 0x38, uVar12 < 0x101))
         || ((lVar11 = 0x40, uVar12 < 0x201 || (lVar11 = 0x48, uVar12 < 0x401)))) {
        plVar2 = (long *)((long)&pCVar4->size + lVar11);
        *plVar2 = *plVar2 + 1;
      }
    }
    memory_usage->total = memory_usage->total + lVar7;
    auVar15._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar15._0_8_ = lVar7;
    auVar15._12_4_ = 0x45300000;
    auVar16._8_4_ = uVar19;
    auVar16._0_8_ = sVar8;
    auVar16._12_4_ = 0x45300000;
    memory_usage->fair_share =
         ((auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
         ((auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0)) + memory_usage->fair_share;
LAB_00138cb4:
    pCVar10 = (CordRep *)0x0;
    sVar8 = 0;
  }
LAB_00138cb8:
  RVar20.refcount = sVar8;
  RVar20.rep = pCVar10;
  return RVar20;
}

Assistant:

RepRef CountLinearReps(RepRef rep, MemoryUsage& memory_usage) {
    // Consume all substrings
    while (rep.tag() == SUBSTRING) {
      statistics_.node_count++;
      statistics_.node_counts.substring++;
      memory_usage.Add(sizeof(CordRepSubstring), rep.refcount);
      rep = rep.Child(rep.rep->substring()->child);
    }

    // Consume possible FLAT
    if (rep.tag() >= FLAT) {
      size_t size = rep.rep->flat()->AllocatedSize();
      CountFlat(size);
      memory_usage.Add(size, rep.refcount);
      return RepRef{nullptr, 0};
    }

    // Consume possible external
    if (rep.tag() == EXTERNAL) {
      statistics_.node_count++;
      statistics_.node_counts.external++;
      size_t size = rep.rep->length + sizeof(CordRepExternalImpl<intptr_t>);
      memory_usage.Add(size, rep.refcount);
      return RepRef{nullptr, 0};
    }

    return rep;
  }